

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_checkstack(lua_State *L,int n)

{
  CallInfo *pCVar1;
  int *piVar2;
  int iVar3;
  StkId pTVar4;
  int iVar5;
  int local_1c;
  
  pCVar1 = L->ci;
  iVar5 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar5 + 1;
  local_1c = n;
  if (iVar5 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x69,"int lua_checkstack(lua_State *, int)");
  }
  if (n < 0) {
    __assert_fail("(n >= 0) && \"negative \'n\'\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x6a,"int lua_checkstack(lua_State *, int)");
  }
  pTVar4 = L->top;
  if ((long)L->stack_last - (long)pTVar4 >> 4 <= (long)(ulong)(uint)n) {
    iVar5 = 0;
    if (1000000 - n < (int)((ulong)((long)pTVar4 - (long)L->stack) >> 4) + 5) goto LAB_0011fe1b;
    iVar3 = luaD_rawrunprotected(L,growstack,&local_1c);
    iVar5 = 0;
    if (iVar3 != 0) goto LAB_0011fe1b;
    pTVar4 = L->top;
  }
  iVar5 = 1;
  if (pCVar1->top < pTVar4 + local_1c) {
    pCVar1->top = pTVar4 + local_1c;
  }
LAB_0011fe1b:
  piVar2 = *(int **)&L[-1].hookmask;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    return iVar5;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x76,"int lua_checkstack(lua_State *, int)");
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int n) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  api_check(L, n >= 0, "negative 'n'");
  if (L->stack_last - L->top > n)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - n)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &n) == LUA_OK);
  }
  if (res && ci->top < L->top + n)
    ci->top = L->top + n;  /* adjust frame top */
  lua_unlock(L);
  return res;
}